

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O1

bool cppcms::url_dispatcher::parse<stuff::foo>
               (application *app,const_char_istream *p,cmatch *m,int group,foo *v)

{
  char cVar1;
  char *begin;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  if (((group < 0) || ((int)((ulong)(*(long *)(m + 0x18) - *(long *)(m + 0x10)) >> 3) <= group)) ||
     (lVar4 = (long)*(int *)(*(long *)(m + 0x10) + (ulong)(uint)group * 8), lVar4 == -1)) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)(lVar4 + *(long *)m);
  }
  if (((group < 0) ||
      (lVar4 = *(long *)(m + 0x10), (int)((ulong)(*(long *)(m + 0x18) - lVar4) >> 3) <= group)) ||
     (*(int *)(lVar4 + (ulong)(uint)group * 8) == -1)) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)((long)*(int *)(lVar4 + 4 + (ulong)(uint)group * 8) + *(long *)m);
  }
  cVar1 = cppcms::url_dispatcher::validate_encoding(app,pcVar5,pcVar3);
  if (cVar1 != '\0') {
    if (((group < 0) || ((int)((ulong)(*(long *)(m + 0x18) - *(long *)(m + 0x10)) >> 3) <= group))
       || (lVar4 = (long)*(int *)(*(long *)(m + 0x10) + (ulong)(uint)group * 8), lVar4 == -1)) {
      lVar4 = 0;
    }
    else {
      lVar4 = lVar4 + *(long *)m;
    }
    if (((group < 0) ||
        (lVar2 = *(long *)(m + 0x10), (int)((ulong)(*(long *)(m + 0x18) - lVar2) >> 3) <= group)) ||
       (*(int *)(lVar2 + (ulong)(uint)group * 8) == -1)) {
      lVar2 = 0;
    }
    else {
      lVar2 = (long)*(int *)(lVar2 + 4 + (ulong)(uint)group * 8) + *(long *)m;
    }
    *(long *)&(p->super_istream).field_0x18 = lVar4;
    *(long *)&(p->super_istream).field_0x20 = lVar4;
    *(long *)&(p->super_istream).field_0x28 = lVar2;
    std::ios::clear((int)(p->super_istream)._vptr_basic_istream[-3] + (int)p);
    v->l = *(int *)&(p->super_istream).field_0x28 - *(int *)&(p->super_istream).field_0x18;
  }
  return (bool)cVar1;
}

Assistant:

static bool parse(application &app,util::const_char_istream &p,booster::cmatch const &m,int group,T &v)
		{
			if(!validate_encoding(app,m[group].first,m[group].second))
				return false;
			p.range(m[group].first,m[group].second);
			return parse_url_parameter(p,v);
		}